

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O1

int __thiscall QHttpNetworkConnectionChannel::close(QHttpNetworkConnectionChannel *this,int __fd)

{
  SocketState SVar1;
  int iVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 getState;
  anon_class_1_0_00000001 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(this + 0x20) != 0x10) {
    if (*(QIODevice **)(this + 0x10) == (QIODevice *)0x0) {
      iVar2 = 0;
    }
    else {
      local_11 = (anon_class_1_0_00000001)0xaa;
      SVar1 = QSocketAbstraction::
              visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                        (&local_11,*(QIODevice **)(this + 0x10));
      iVar2 = (uint)(SVar1 != UnconnectedState) << 4;
    }
    *(int *)(this + 0x20) = iVar2;
    this[0x58] = (QHttpNetworkConnectionChannel)0x0;
    if (*(long **)(this + 0x10) != (long *)0x0) {
      (**(code **)(**(long **)(this + 0x10) + 0x70))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::close()
{
    if (state == QHttpNetworkConnectionChannel::ClosingState)
        return;

    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        socket->close();
    }
}